

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

void __thiscall ON_GeometryValue::~ON_GeometryValue(ON_GeometryValue *this)

{
  uint uVar1;
  ON_Geometry **ppOVar2;
  ON_Geometry *pOVar3;
  ulong uVar4;
  ulong uVar5;
  
  (this->super_ON_Value)._vptr_ON_Value = (_func_int **)&PTR__ON_GeometryValue_008288b0;
  uVar1 = (this->m_value).m_count;
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    ppOVar2 = (this->m_value).m_a;
    pOVar3 = ppOVar2[uVar5];
    ppOVar2[uVar5] = (ON_Geometry *)0x0;
    if (pOVar3 != (ON_Geometry *)0x0) {
      (*(pOVar3->super_ON_Object)._vptr_ON_Object[4])();
    }
  }
  ON_SimpleArray<ON_Geometry_*>::~ON_SimpleArray(&this->m_value);
  return;
}

Assistant:

ON_GeometryValue::~ON_GeometryValue()
{
  int i, count = m_value.Count();
  for ( i = 0; i < count; i++ )
  {
    ON_Geometry* p = m_value[i];
    m_value[i] = 0;
    if (p)
    {
      delete p;
    }
  }
}